

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O1

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint v;
  long lVar1;
  undefined4 uVar2;
  ulong in_RAX;
  char *pcVar3;
  uint8_t zero;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((*(int *)((long)ud + 8) - *(int *)((long)ud + 0x10) & 0xfffffc00U) == 0) {
    lj_buf_need2((SBuf *)ud,0x400);
  }
  lVar1 = *(long *)(*(long *)((long)ud + 0x20) + 0x40);
  v = *(uint *)(lVar1 + 0x14);
  pcVar3 = *(char **)((long)ud + 0x10);
  if ((uint)(*(int *)((long)ud + 8) - (int)pcVar3) < v + 10) {
    pcVar3 = lj_buf_need2((SBuf *)ud,v + 10);
  }
  pcVar3[0] = '\x1b';
  pcVar3[1] = 'L';
  pcVar3[2] = 'J';
  pcVar3[3] = '\x02';
  pcVar3[4] = (*(int *)((long)ud + 0x38) != 0) * '\x02' |
              *(byte *)(*(long *)((long)ud + 0x20) + 0x3d) & 4 | 8;
  pcVar3 = pcVar3 + 5;
  if (*(int *)((long)ud + 0x38) == 0) {
    pcVar3 = lj_strfmt_wuleb128(pcVar3,v);
    memcpy(pcVar3,(void *)(lVar1 + 0x18),(ulong)v);
    pcVar3 = pcVar3 + v;
  }
  uVar2 = (**(code **)((long)ud + 0x28))
                    (*(ulong *)((long)ud + 0x18) & 0xfffffffffffffff8,
                     *(undefined8 *)((long)ud + 0x10),
                     (int)pcVar3 - (int)*(undefined8 *)((long)ud + 0x10),
                     *(undefined8 *)((long)ud + 0x30));
  *(undefined4 *)((long)ud + 0x3c) = uVar2;
  bcwrite_proto((BCWriteCtx *)ud,*(GCproto **)((long)ud + 0x20));
  if (*(int *)((long)ud + 0x3c) == 0) {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    uVar2 = (**(code **)((long)ud + 0x28))
                      (*(ulong *)((long)ud + 0x18) & 0xfffffffffffffff8,(long)&uStack_28 + 7,1,
                       *(undefined8 *)((long)ud + 0x30));
    *(undefined4 *)((long)ud + 0x3c) = uVar2;
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(L); UNUSED(dummy);
  lj_buf_need(&ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}